

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_nameLength(ENCODING *enc,char *ptr)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  
  iVar1 = (int)ptr;
  do {
    bVar2 = *ptr;
    lVar3 = 2;
    if (bVar2 < 0xdc) {
      if (bVar2 - 0xd8 < 4) {
        lVar3 = 4;
      }
      else if (bVar2 == 0) {
        bVar2 = *(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]) - 5;
        if ((0x18 < bVar2) || ((0x17e0007U >> (bVar2 & 0x1f) & 1) == 0)) {
LAB_0015d038:
          return (int)ptr - iVar1;
        }
        lVar3 = *(long *)(&DAT_001de6f0 + (ulong)bVar2 * 8);
      }
    }
    else if (bVar2 == 0xff) {
      if (0xfd < ((byte *)ptr)[1]) goto LAB_0015d038;
    }
    else if (bVar2 - 0xdc < 4) goto LAB_0015d038;
    ptr = (char *)((byte *)ptr + lVar3);
  } while( true );
}

Assistant:

static
int PREFIX(nameLength)(const ENCODING *enc, const char *ptr)
{
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr - start;
    }
  }
}